

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorTiledBox.cpp
# Opt level: O0

SharedPtr<Decorator> __thiscall
Rml::DecoratorTiledBoxInstancer::InstanceDecorator
          (DecoratorTiledBoxInstancer *this,String *param_1,PropertyDictionary *properties,
          DecoratorInstancerInterface *instancer_interface)

{
  bool bVar1;
  element_type *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  DecoratorInstancerInterface *in_R8;
  SharedPtr<Decorator> SVar3;
  Texture *local_3d0;
  Tile *local_3a0;
  undefined1 local_388 [8];
  SharedPtr<Rml::DecoratorTiledBox> decorator;
  Texture textures [9];
  Tile tiles [9];
  size_t num_tiles;
  DecoratorInstancerInterface *instancer_interface_local;
  PropertyDictionary *properties_local;
  String *param_1_local;
  DecoratorTiledBoxInstancer *this_local;
  
  stack0xffffffffffffffc8 = 9;
  local_3a0 = (Tile *)&textures[8].file_index;
  do {
    DecoratorTiled::Tile::Tile(local_3a0);
    local_3a0 = local_3a0 + 1;
  } while (local_3a0 != (Tile *)(tiles[8].align + 1));
  local_3d0 = (Texture *)
              &decorator.super___shared_ptr<Rml::DecoratorTiledBox,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount;
  do {
    Texture::Texture(local_3d0);
    local_3d0 = local_3d0 + 1;
  } while (local_3d0 != (Texture *)&textures[8].file_index);
  bVar1 = DecoratorTiledInstancer::GetTileProperties
                    ((DecoratorTiledInstancer *)param_1,(Tile *)&textures[8].file_index,
                     (Texture *)
                     &decorator.
                      super___shared_ptr<Rml::DecoratorTiledBox,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,9,(PropertyDictionary *)instancer_interface,in_R8);
  if (bVar1) {
    MakeShared<Rml::DecoratorTiledBox>();
    this_00 = ::std::
              __shared_ptr_access<Rml::DecoratorTiledBox,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<Rml::DecoratorTiledBox,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_388);
    bVar1 = DecoratorTiledBox::Initialise
                      (this_00,(Tile *)&textures[8].file_index,
                       (Texture *)
                       &decorator.
                        super___shared_ptr<Rml::DecoratorTiledBox,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
    if (bVar1) {
      ::std::shared_ptr<Rml::Decorator>::shared_ptr<Rml::DecoratorTiledBox,void>
                ((shared_ptr<Rml::Decorator> *)this,(shared_ptr<Rml::DecoratorTiledBox> *)local_388)
      ;
    }
    else {
      ::std::shared_ptr<Rml::Decorator>::shared_ptr
                ((shared_ptr<Rml::Decorator> *)this,(nullptr_t)0x0);
    }
    ::std::shared_ptr<Rml::DecoratorTiledBox>::~shared_ptr
              ((shared_ptr<Rml::DecoratorTiledBox> *)local_388);
    _Var2._M_pi = extraout_RDX_00;
  }
  else {
    ::std::shared_ptr<Rml::Decorator>::shared_ptr((shared_ptr<Rml::Decorator> *)this,(nullptr_t)0x0)
    ;
    _Var2._M_pi = extraout_RDX;
  }
  SVar3.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  SVar3.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (SharedPtr<Decorator>)SVar3.super___shared_ptr<Rml::Decorator,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SharedPtr<Decorator> DecoratorTiledBoxInstancer::InstanceDecorator(const String& /*name*/, const PropertyDictionary& properties,
	const DecoratorInstancerInterface& instancer_interface)
{
	constexpr size_t num_tiles = 9;

	DecoratorTiled::Tile tiles[num_tiles];
	Texture textures[num_tiles];

	if (!GetTileProperties(tiles, textures, num_tiles, properties, instancer_interface))
		return nullptr;

	auto decorator = MakeShared<DecoratorTiledBox>();
	if (!decorator->Initialise(tiles, textures))
		return nullptr;

	return decorator;
}